

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::
FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
::hasNext(FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
          *this)

{
  bool bVar1;
  anon_class_1_0_00000001_for__func *in_RDI;
  _ElementType next;
  Option<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_stack_ffffffffffffff38;
  Option<Inferences::AnyNumber<Kernel::MonomFactor>_> *this_00;
  AnyNumber<Kernel::MonomFactor> *in_stack_ffffffffffffff48;
  __doDeletion<false> local_a5 [17];
  Option<Inferences::AnyNumber<Kernel::MonomFactor>_> local_94 [4];
  bool local_1;
  
  bVar1 = OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::isSome
                    ((OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)(in_RDI + 0x20));
  if (bVar1) {
    local_1 = true;
  }
  else {
    while (bVar1 = MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>
                   ::hasNext((MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>
                              *)0x732168), bVar1) {
      MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>
      ::next((MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>
              *)in_stack_ffffffffffffff48);
      move_if_value<Inferences::AnyNumber<Kernel::MonomFactor>,_true>
                ((AnyNumber<Kernel::MonomFactor> *)in_stack_ffffffffffffff38);
      bVar1 = Inferences::VariableMultiplicationGeneralizationImpl::applyRule(Kernel::Clause*,bool)
              ::$_1::operator()(in_RDI,in_stack_ffffffffffffff48);
      if (bVar1) {
        this_00 = local_94;
        move_if_value<Inferences::AnyNumber<Kernel::MonomFactor>,_true>
                  ((AnyNumber<Kernel::MonomFactor> *)in_stack_ffffffffffffff38);
        Option<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase
                  (this_00,(AnyNumber<Kernel::MonomFactor> *)in_stack_ffffffffffffff38);
        Option<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator=
                  (this_00,in_stack_ffffffffffffff38);
        Option<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Option
                  ((Option<Inferences::AnyNumber<Kernel::MonomFactor>_> *)0x7321f8);
        return true;
      }
      __doDeletion<false>::operator()
                (local_a5,(MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>
                           *)(in_RDI + 8));
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }